

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

IVec3 __thiscall deqp::gles31::Functional::defaultImageSize(Functional *this,TextureType type)

{
  undefined8 uVar1;
  int in_EDX;
  int extraout_EDX;
  IVec3 IVar2;
  
  switch(type) {
  case TEXTURETYPE_2D:
  case TEXTURETYPE_CUBE:
    uVar1 = 0x4000000040;
    break;
  case TEXTURETYPE_2D_ARRAY:
  case TEXTURETYPE_3D:
    *(undefined8 *)this = 0x4000000040;
    *(undefined4 *)(this + 8) = 8;
    goto LAB_00454d2d;
  default:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,-1);
    in_EDX = extraout_EDX;
    goto LAB_00454d2d;
  case TEXTURETYPE_BUFFER:
    uVar1 = 0x100000040;
  }
  *(undefined8 *)this = uVar1;
  *(undefined4 *)(this + 8) = 1;
LAB_00454d2d:
  IVar2.m_data[2] = in_EDX;
  IVar2.m_data._0_8_ = this;
  return (IVec3)IVar2.m_data;
}

Assistant:

static inline IVec3 defaultImageSize (TextureType type)
{
	switch (type)
	{
		case TEXTURETYPE_BUFFER:	return IVec3(64,	1,		1);
		case TEXTURETYPE_2D:		return IVec3(64,	64,		1);
		case TEXTURETYPE_CUBE:		return IVec3(64,	64,		1);
		case TEXTURETYPE_3D:		return IVec3(64,	64,		8);
		case TEXTURETYPE_2D_ARRAY:	return IVec3(64,	64,		8);
		default:
			DE_ASSERT(false);
			return IVec3(-1);
	}
}